

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O3

bool google::sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
               (_IO_FILE *fp,unsigned_long value,size_t length)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 local_41;
  size_t local_40;
  FILE *local_38;
  
  if (length == 0) {
    bVar6 = true;
  }
  else {
    bVar6 = false;
    local_41 = (char)(value >> ((char)(length - 1) * '\b' & 0x3fU));
    if (7 < length - 1) {
      local_41 = 0;
    }
    sVar2 = fwrite(&local_41,1,1,(FILE *)fp);
    if (sVar2 == 1) {
      uVar3 = length - 2;
      lVar4 = length * 8 + -0x10;
      uVar1 = 1;
      local_40 = length;
      local_38 = (FILE *)fp;
      do {
        uVar5 = uVar1;
        if (uVar3 == 0xffffffffffffffff) break;
        local_41 = (undefined1)(value >> ((byte)lVar4 & 0x3f));
        if (7 < uVar3) {
          local_41 = 0;
        }
        sVar2 = fwrite(&local_41,1,1,local_38);
        uVar3 = uVar3 - 1;
        lVar4 = lVar4 + -8;
        uVar1 = uVar5 + 1;
      } while (sVar2 == 1);
      bVar6 = local_40 <= uVar5;
    }
  }
  return bVar6;
}

Assistant:

bool write_bigendian_number(OUTPUT* fp, IntType value, size_t length) {
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    byte = (sizeof(value) <= length - 1 - i)
               ? 0
               : static_cast<unsigned char>((value >> ((length - 1 - i) * 8)) &
                                            255);
    if (!write_data(fp, &byte, sizeof(byte))) return false;
  }
  return true;
}